

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cw-bwt.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  ulong uVar5;
  ostream *poVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  long in_RSI;
  int in_EDI;
  undefined1 auVar11 [16];
  uint s_1;
  uint m_1;
  uint s;
  uint m;
  uint h;
  ulint total;
  time_point t2;
  string path_1;
  string path;
  cw_bwt cwbwt;
  time_point t1;
  cw_bwt *in_stack_fffffffffffffa48;
  cw_bwt *in_stack_fffffffffffffa50;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_fffffffffffffa58;
  string *in_stack_fffffffffffffaa8;
  cw_bwt *in_stack_fffffffffffffab0;
  undefined4 in_stack_fffffffffffffb60;
  undefined1 verbose;
  cw_bwt_input_type in_stack_fffffffffffffb64;
  string *in_stack_fffffffffffffb68;
  duration<double,_std::ratio<1L,_1L>_> in_stack_fffffffffffffb70;
  undefined8 in_stack_fffffffffffffb78;
  undefined1 verbose_00;
  undefined8 in_stack_fffffffffffffb80;
  string *in_stack_fffffffffffffb88;
  cw_bwt *in_stack_fffffffffffffb90;
  allocator local_301;
  string local_300 [383];
  allocator local_181;
  string local_180 [32];
  cw_bwt local_160;
  undefined8 local_18;
  long local_10;
  int local_8;
  int local_4;
  
  verbose = (undefined1)((uint)in_stack_fffffffffffffb60 >> 0x18);
  verbose_00 = (undefined1)((ulong)in_stack_fffffffffffffb78 >> 0x38);
  local_4 = 0;
  if ((in_EDI != 3) && (in_EDI != 4)) {
    std::operator<<((ostream *)&std::cout,
                    "*** context-wise BWT construction in compressed space ***\n");
    std::operator<<((ostream *)&std::cout,"Usage: cw-bwt text_file bwt_file [k]\n");
    std::operator<<((ostream *)&std::cout,"where:\n");
    std::operator<<((ostream *)&std::cout,
                    "- text_file is the input text file. Input file must not contain a 0x0 byte since the algorithm uses it as text terminator.\n"
                   );
    std::operator<<((ostream *)&std::cout,
                    "- bwt_file is the output bwt file. This output file will contain a 0x0 terminator and thus will be 1 byte longer than the input file.\n"
                   );
    std::operator<<((ostream *)&std::cout,
                    "- k (automatically detected if not specified) is the entropy order (context length).\n"
                   );
    std::operator<<((ostream *)&std::cout,
                    "WARNING: for high values of k, the memory requirements approach n log n. If you specify k, choose it carefully!\n"
                   );
    std::operator<<((ostream *)&std::cout,"For more informations, read the file README.\n");
    exit(0);
  }
  local_10 = in_RSI;
  local_8 = in_EDI;
  local_18 = std::chrono::_V2::system_clock::now();
  bwtil::cw_bwt::cw_bwt(in_stack_fffffffffffffa50);
  if (local_8 == 3) {
    pcVar1 = *(char **)(local_10 + 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_180,pcVar1,&local_181);
    std::allocator<char>::~allocator((allocator<char> *)&local_181);
    bwtil::cw_bwt::cw_bwt
              ((cw_bwt *)in_stack_fffffffffffffb70.__r,in_stack_fffffffffffffb68,
               in_stack_fffffffffffffb64,(bool)verbose);
    bwtil::cw_bwt::operator=(in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
    bwtil::cw_bwt::~cw_bwt(in_stack_fffffffffffffa50);
    std::__cxx11::string::~string(local_180);
  }
  if (local_8 == 4) {
    pcVar1 = *(char **)(local_10 + 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_300,pcVar1,&local_301);
    std::allocator<char>::~allocator((allocator<char> *)&local_301);
    atoi(*(char **)(local_10 + 0x18));
    bwtil::cw_bwt::cw_bwt
              (in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,
               (cw_bwt_input_type)((ulong)in_stack_fffffffffffffb80 >> 0x20),
               (uint)in_stack_fffffffffffffb80,(bool)verbose_00);
    bwtil::cw_bwt::operator=(in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
    bwtil::cw_bwt::~cw_bwt(in_stack_fffffffffffffa50);
    std::__cxx11::string::~string(local_300);
  }
  pcVar1 = *(char **)(local_10 + 0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xfffffffffffffb90,pcVar1,(allocator *)&stack0xfffffffffffffb8f);
  bwtil::cw_bwt::toFile(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffb90);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffb8f);
  bwtil::cw_bwt::length(&local_160);
  bwtil::printRSSstat((ulint)in_stack_fffffffffffffa50);
  std::chrono::_V2::system_clock::now();
  std::chrono::operator-
            (in_stack_fffffffffffffa58,
             (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              *)in_stack_fffffffffffffa50);
  std::chrono::
  duration_cast<std::chrono::duration<double,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
            ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffffa48);
  auVar11._0_8_ =
       std::chrono::duration<double,_std::ratio<1L,_1L>_>::count
                 ((duration<double,_std::ratio<1L,_1L>_> *)&stack0xfffffffffffffb70);
  auVar11._8_8_ = 0;
  uVar5 = vcvttsd2usi_avx512f(auVar11);
  if (uVar5 < 0xe10) {
    if (uVar5 < 0x3c) {
      poVar6 = std::operator<<((ostream *)&std::cout,"Total time: ");
      in_stack_fffffffffffffa50 = (cw_bwt *)std::ostream::operator<<(poVar6,uVar5);
      poVar6 = std::operator<<((ostream *)in_stack_fffffffffffffa50," seconds.");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    }
    else {
      uVar10 = uVar5 / 0x3c;
      uVar8 = uVar5 / 0x3c;
      iVar4 = (int)uVar5;
      poVar6 = std::operator<<((ostream *)&std::cout,"Total time: ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar5);
      poVar6 = std::operator<<(poVar6," seconds. (");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,(uint)uVar10);
      poVar6 = std::operator<<(poVar6,"m ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar4 + (int)uVar8 * -0x3c);
      poVar6 = std::operator<<(poVar6,"s");
      poVar6 = std::operator<<(poVar6,")");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    }
  }
  else {
    uVar7 = (uint)(uVar5 / 0xe10);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar5 % 0xe10;
    uVar9 = SUB164(auVar2 * ZEXT816(0x444444444444445),8);
    uVar10 = uVar5 % 0xe10;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar10;
    poVar6 = std::operator<<((ostream *)&std::cout,"Total time: ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar5);
    poVar6 = std::operator<<(poVar6," seconds. (");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar7);
    poVar6 = std::operator<<(poVar6,"h ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar9);
    poVar6 = std::operator<<(poVar6,"m ");
    poVar6 = (ostream *)
             std::ostream::operator<<
                       (poVar6,(int)uVar10 + SUB164(auVar3 * ZEXT816(0x444444444444445),8) * -0x3c);
    poVar6 = std::operator<<(poVar6,"s");
    poVar6 = std::operator<<(poVar6,")");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  bwtil::cw_bwt::~cw_bwt(in_stack_fffffffffffffa50);
  return local_4;
}

Assistant:

int main(int argc,char** argv) {

#ifdef DEBUG
	 cout << "\n ****** DEBUG MODE ******\n\n";
#endif

	if(argc != 3 and argc != 4){
		cout << "*** context-wise BWT construction in compressed space ***\n";
		cout << "Usage: cw-bwt text_file bwt_file [k]\n";
		cout << "where:\n";
		cout << "- text_file is the input text file. Input file must not contain a 0x0 byte since the algorithm uses it as text terminator.\n";
		cout << "- bwt_file is the output bwt file. This output file will contain a 0x0 terminator and thus will be 1 byte longer than the input file.\n";
		cout << "- k (automatically detected if not specified) is the entropy order (context length).\n";
		cout << "WARNING: for high values of k, the memory requirements approach n log n. If you specify k, choose it carefully!\n";
		cout << "For more informations, read the file README.\n";
		exit(0);
	}

    using std::chrono::high_resolution_clock;
    using std::chrono::duration_cast;
    using std::chrono::duration;

    auto t1 = high_resolution_clock::now();

	cw_bwt cwbwt;

	/*
	 * Note: in this example, the text is loaded from disk and the bwt is directly saved to disk. The total RAM occupancy is therefore COMPRESSED, i.e.
	 * comparable to the size of the compressed input text file.
	 *
	 * It is possible (see comments below) also to build the bwt from/to strings, but in this way also the input/output strings will be stored in memory,
	 * resulting in higher RAM requirements.
	 *
	 * If you want to keep RAM usage to a minimum, it is recommended that you proceed as follows:
	 *
	 * 1) save your text (string/array) to disk
	 * 2) free memory
	 * 3) run cw-bwt loading the text from the file created in step 1) (see below)
	 * 4) save directly the bwt to disk (see below)
	 * 5) free memory
	 * 6) load in RAM the bwt created in step 4)
	 *
	 */

	//build bwt from a text file:

	if(argc==3){//k autodetected
		string path(argv[1]);
		//cw_bwt::path means that the first argument has to be interpreted as a file path rather than a text string
		cwbwt = cw_bwt(path,cw_bwt::path,true);
	}
	if(argc==4){//the user has specified k
		string path(argv[1]);
		cwbwt = cw_bwt(path,cw_bwt::path,atoi(argv[3]),true);
	}
	/*
	 * If, instead, you want to compute the bwt of a string, create a cw_bwt object as follows:
	 *
	 *
	 * string str = "mississippi";
	 * cwbwt = cw_bwt(str,cw_bwt::text); // optimal k autodetected
	 *
	 * or
	 *
	 * cwbwt = cw_bwt(str,cw_bwt::text, your_k_value,true); // you choose k
	 *
	 * However, this requires more space in RAM since the input text string is kept in memory together with the structures of cwbwt
	 *
	 */

	//save to file the bwt without occupying additional RAM
	cwbwt.toFile(argv[2]);

	/*
	 * If, instead, you want a string object containing the bwt, call
	 *
	 * string bwt = cwbwt.toString();
	 *
	 * However, this requires more space in RAM since the string bwt is kept in memory together with the structures of cwbwt
	 * WARNING: if you directly print cwbwt.toString(), you won't see the terminator character since it is a 0x0 byte.
	 *
	 */

	printRSSstat(cwbwt.length());

	auto t2 = high_resolution_clock::now();
	ulint total = duration_cast<duration<double, std::ratio<1>>>(t2 - t1).count();

	if(total>=3600){

		uint h = total/3600;
		uint m = (total%3600)/60;
		uint s = (total%3600)%60;

		cout << "Total time: " << total << " seconds. ("<< h << "h " << m << "m " << s << "s" << ")"<<endl;

	}else if (total>=60){

		uint m = total/60;
		uint s = total%60;

		cout << "Total time: " << total << " seconds. ("<< m << "m " << s << "s" << ")"<<endl;

	}else{

		cout << "Total time: " << total << " seconds." << endl;

	}
 }